

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void Args::calcMaxFlagAndName(ArgIface *arg,size_type *maxFlag,size_type *maxName)

{
  ulong uVar1;
  long lVar2;
  ulong *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  bool bVar3;
  size_type n;
  size_type f;
  ulong local_60;
  ulong local_58;
  string local_48 [32];
  ulong local_28;
  ulong local_20;
  ulong *local_18;
  ulong *local_10;
  long *local_8;
  
  local_20 = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x40))();
  uVar1 = std::__cxx11::string::empty();
  bVar3 = false;
  if ((uVar1 & 1) == 0) {
    (**(code **)(*local_8 + 0x40))();
    local_58 = std::__cxx11::string::length();
  }
  else {
    (**(code **)(*local_8 + 0x38))();
    uVar1 = std::__cxx11::string::empty();
    bVar3 = (uVar1 & 1) != 0;
    if (bVar3) {
      (**(code **)(*local_8 + 0x18))(local_48);
      local_60 = std::__cxx11::string::length();
    }
    else {
      local_60 = 0;
    }
    local_58 = local_60;
  }
  if (bVar3) {
    std::__cxx11::string::~string(local_48);
  }
  local_28 = local_58;
  uVar1 = (**(code **)(*local_8 + 0x20))();
  if ((uVar1 & 1) != 0) {
    if (local_28 == 0) {
      (**(code **)(*local_8 + 0x48))();
      lVar2 = std::__cxx11::string::length();
      local_20 = lVar2 + 3 + local_20;
    }
    else {
      (**(code **)(*local_8 + 0x48))();
      lVar2 = std::__cxx11::string::length();
      local_28 = lVar2 + 3 + local_28;
    }
  }
  if (*local_10 < local_20) {
    *local_10 = local_20;
  }
  if (*local_18 < local_28) {
    *local_18 = local_28;
  }
  return;
}

Assistant:

static inline void
calcMaxFlagAndName( ArgIface * arg, String::size_type & maxFlag,
	String::size_type & maxName )
{
	String::size_type f = 1;
	String::size_type n = ( !arg->argumentName().empty() ?
		arg->argumentName().length() : ( arg->flag().empty() ?
			arg->name().length() : 0 ) );

	if( arg->isWithValue() )
	{
		if( n > 0 )
			n += 3 + arg->valueSpecifier().length();
		else
			f += 3 + arg->valueSpecifier().length();
	}

	if( f > maxFlag )
		maxFlag = f;

	if( n > maxName )
		maxName = n;
}